

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O0

InsertResult __thiscall
wasm::UnorderedFixedStorage<wasm::Name,_10UL>::insert
          (UnorderedFixedStorage<wasm::Name,_10UL> *this,Name *x)

{
  size_type __n;
  bool bVar1;
  IString *this_00;
  reference this_01;
  ulong local_28;
  size_t i;
  Name *x_local;
  UnorderedFixedStorage<wasm::Name,_10UL> *this_local;
  
  local_28 = 0;
  while( true ) {
    if ((this->super_FixedStorageBase<wasm::Name,_10UL>).used <= local_28) {
      if (10 < (this->super_FixedStorageBase<wasm::Name,_10UL>).used) {
        __assert_fail("this->used <= N",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                      ,0x3e,
                      "InsertResult wasm::UnorderedFixedStorage<wasm::Name, 10>::insert(const T &) [T = wasm::Name, N = 10]"
                     );
      }
      bVar1 = (this->super_FixedStorageBase<wasm::Name,_10UL>).used != 10;
      if (bVar1) {
        __n = (this->super_FixedStorageBase<wasm::Name,_10UL>).used;
        (this->super_FixedStorageBase<wasm::Name,_10UL>).used = __n + 1;
        this_01 = std::array<wasm::Name,_10UL>::operator[]
                            (&(this->super_FixedStorageBase<wasm::Name,_10UL>).storage,__n);
        wasm::Name::operator=(this_01,x);
      }
      this_local._4_4_ = (InsertResult)!bVar1;
      return this_local._4_4_;
    }
    this_00 = &std::array<wasm::Name,_10UL>::operator[]
                         (&(this->super_FixedStorageBase<wasm::Name,_10UL>).storage,local_28)->
               super_IString;
    bVar1 = IString::operator==(this_00,&x->super_IString);
    if (bVar1) break;
    local_28 = local_28 + 1;
  }
  return NoError;
}

Assistant:

InsertResult insert(const T& x) {
    for (size_t i = 0; i < this->used; i++) {
      if (this->storage[i] == x) {
        return InsertResult::NoError;
      }
    }
    assert(this->used <= N);
    if (this->used == N) {
      return InsertResult::CouldNotInsert;
    }
    this->storage[this->used++] = x;
    return InsertResult::NoError;
  }